

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<int>_>::extendBy(Box<Imath_2_5::Vec3<int>_> *this,Vec3<int> *point)

{
  int iVar1;
  int *piVar2;
  Vec3<int> *in_RSI;
  Vec3<int> *in_RDI;
  
  piVar2 = Vec3<int>::operator[](in_RSI,0);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,0);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,0);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,0);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,0);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,0);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI,0);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,0);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,1);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,1);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,1);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,1);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,1);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,1);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI,1);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,1);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,2);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,2);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,2);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,2);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,2);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,2);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI,2);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,2);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec3<T> >::extendBy (const Vec3<T> &point)
{
    if (point[0] < min[0])
        min[0] = point[0];

    if (point[0] > max[0])
        max[0] = point[0];

    if (point[1] < min[1])
        min[1] = point[1];

    if (point[1] > max[1])
        max[1] = point[1];

    if (point[2] < min[2])
        min[2] = point[2];

    if (point[2] > max[2])
        max[2] = point[2];
}